

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

int malloc_trim(size_t pad)

{
  int iVar1;
  int result;
  size_t pad_local;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar1 = sys_trim(&_gm_,pad);
  return iVar1;
}

Assistant:

int dlmalloc_trim(size_t pad) {
  int result = 0;
  ensure_initialization();
  if (!PREACTION(gm)) {
    result = sys_trim(gm, pad);
    POSTACTION(gm);
  }
  return result;
}